

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::XPathScanner::scanNumber
          (XPathScanner *this,XMLCh *data,XMLSize_t endOffset,XMLSize_t currentOffset,
          ValueVectorOf<int> *tokens)

{
  XMLCh *pXVar1;
  uint uVar2;
  int iVar3;
  RuntimeException *this_00;
  XMLSize_t XVar4;
  XMLCh XVar5;
  XMLSize_t XVar6;
  undefined8 local_18;
  
  XVar4 = currentOffset + 1;
  uVar2 = 0;
  XVar5 = data[currentOffset];
  while ((ushort)(XVar5 + L'￐') < 10) {
    uVar2 = (uVar2 * 10 + (uint)(ushort)XVar5) - 0x30;
    if (endOffset == XVar4) {
      local_18 = (ulong)uVar2 << 0x20;
      XVar4 = endOffset;
      goto LAB_00305b05;
    }
    pXVar1 = data + XVar4;
    XVar4 = XVar4 + 1;
    XVar5 = *pXVar1;
  }
  local_18 = (ulong)uVar2 << 0x20;
  if (XVar5 == L'.') {
    if (XVar4 < endOffset) {
      iVar3 = 0;
      do {
        XVar6 = XVar4;
        if (9 < (ushort)(data[XVar4] + L'￐')) break;
        iVar3 = iVar3 * 10 + (uint)(ushort)data[XVar4] + -0x30;
        XVar4 = XVar4 + 1;
        XVar6 = endOffset;
      } while (endOffset != XVar4);
      local_18 = CONCAT44(uVar2,iVar3);
      XVar4 = XVar6;
      if (iVar3 != 0) {
        this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                   ,0x580,XPath_FindSolution,tokens->fMemoryManager);
        __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
    }
  }
  else {
    XVar4 = XVar4 - 1;
  }
LAB_00305b05:
  ValueVectorOf<int>::addElement(tokens,(int *)((long)&local_18 + 4));
  ValueVectorOf<int>::addElement(tokens,(int *)&local_18);
  return XVar4;
}

Assistant:

XMLSize_t XPathScanner::scanNumber(const XMLCh* const data,
                             const XMLSize_t endOffset,
                             XMLSize_t currentOffset,
                             ValueVectorOf<int>* const tokens) {

    XMLCh ch = data[currentOffset];
    int   whole = 0;
    int   part = 0;

    while (ch >= chDigit_0 && ch <= chDigit_9) {

        whole = (whole * 10) + (ch - chDigit_0);

        if (++currentOffset == endOffset) {
            break;
        }

        ch = data[currentOffset];
    }

    if (ch == chPeriod) {

        if (++currentOffset < endOffset) {

            ch = data[currentOffset];

            while (ch >= chDigit_0 && ch <= chDigit_9) {

                part = (part * 10) + (ch - chDigit_0);

                if (++currentOffset == endOffset) {
                    break;
                }

                ch = data[currentOffset];
            }

            if (part != 0) {
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::XPath_FindSolution, tokens->getMemoryManager());
            }
        }
    }

    tokens->addElement(whole);
    tokens->addElement(part);

    return currentOffset;
}